

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp1_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  bVar2 = (char)iVar - 6;
  iVar1 = 1;
  uVar6 = 1 << (bVar2 & 0x1f);
  uVar7 = (-2 << (bVar2 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar2 & 0x1f)) + nWords;
  iVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
  }
  do {
    if ((int)uVar7 < 0) {
LAB_0048a86d:
      *pDifStart = iVar3;
      return iVar1;
    }
    for (lVar8 = 0; -lVar8 != uVar4; lVar8 = lVar8 + -1) {
      iVar5 = -(uint)(pInOut[(ulong)uVar7 + lVar8] <
                     pInOut[((ulong)uVar7 + lVar8) - (long)(int)uVar6]);
      if (pInOut[((ulong)uVar7 + lVar8) - (long)(int)uVar6] < pInOut[(ulong)uVar7 + lVar8]) {
        iVar5 = 1;
      }
      if (iVar5 != 0) {
        iVar3 = uVar6 + uVar7 + 1;
        if (iVar5 != -1) {
          iVar1 = 2;
        }
        goto LAB_0048a86d;
      }
    }
    uVar7 = uVar7 + (-4 << (bVar2 & 0x1f));
  } while( true );
}

Assistant:

int minTemp1_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp1_fast_moreThen5\n");

    for(i=nWords - wordBlock - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+wordBlock+1;
                return 1;
            }
            else
            {
                *pDifStart = i+wordBlock+1;
                return 2;
            }
        }
    *pDifStart=0;
//    printf("out minTemp1_fast_moreThen5\n");

    return 1;
}